

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink.c
# Opt level: O2

Gia_Man_t * Gia_ManMapShrink4(Gia_Man_t *p,int fKeepLevel,int fVerbose)

{
  Vec_Int_t *pVVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Man_t *p_04;
  char *pcVar10;
  Gia_Obj_t *pRoot;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  Gia_Man_t *p_05;
  abctime aVar15;
  int Fill;
  int Fill_00;
  
  aVar9 = Abc_Clock();
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink.c"
                  ,0x3b,"Gia_Man_t *Gia_ManMapShrink4(Gia_Man_t *, int, int)");
  }
  iVar3 = Gia_ManLutSizeMax(p);
  if (iVar3 < 5) {
    p_00 = Vec_IntAlloc(0);
    p_01 = Vec_IntAlloc(0x10000);
    p_02 = Vec_IntAlloc(0);
    p_03 = Vec_IntAlloc(4);
    Dar_LibPrepare(5);
    Gia_ManCleanTruth(p);
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    p_04 = Gia_ManStart(p->nObjs);
    pcVar10 = Abc_UtilStrsav(p->pName);
    p_04->pName = pcVar10;
    pcVar10 = Abc_UtilStrsav(p->pSpec);
    p_04->pSpec = pcVar10;
    Gia_ManHashAlloc(p_04);
    Gia_ManCleanLevels(p_04,p->nObjs);
    iVar3 = 1;
    while ((iVar3 < p->nObjs && (pRoot = Gia_ManObj(p,iVar3), pRoot != (Gia_Obj_t *)0x0))) {
      uVar6 = (uint)*(ulong *)pRoot;
      if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
        pGVar11 = Gia_ManAppendObj(p_04);
        uVar12 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_04->vCis->nSize & 0x1fffffff) << 0x20;
        pVVar1 = p_04->vCis;
        iVar4 = Gia_ObjId(p_04,pGVar11);
        Vec_IntPush(pVVar1,iVar4);
        iVar4 = Gia_ObjId(p_04,pGVar11);
        pRoot->Value = iVar4 * 2;
        if (p->vLevels != (Vec_Int_t *)0x0) {
          pGVar11 = Gia_ObjFromLit(p_04,iVar4 * 2);
          iVar4 = Gia_ObjId(p,pRoot);
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,iVar4 + 1,Fill);
          iVar4 = Vec_IntEntry(pVVar1,iVar4);
          iVar5 = Gia_ObjId(p_04,pGVar11);
          pVVar1 = p_04->vLevels;
          Vec_IntFillExtra(pVVar1,iVar5 + 1,Fill_00);
          Vec_IntWriteEntry(pVVar1,iVar5,iVar4);
        }
      }
      else {
        uVar12 = *(ulong *)pRoot & 0x1fffffff;
        if (uVar12 == 0x1fffffff || -1 < (int)uVar6) {
          iVar4 = Vec_IntEntry(p->vMapping,iVar3);
          if (iVar4 != 0) {
            p_00->nSize = 0;
            uVar12 = 0;
            while( true ) {
              pVVar1 = p->vMapping;
              iVar4 = Vec_IntEntry(pVVar1,iVar3);
              iVar4 = Vec_IntEntry(pVVar1,iVar4);
              if ((long)iVar4 <= (long)uVar12) break;
              pVVar1 = p->vMapping;
              uVar6 = Vec_IntEntry(pVVar1,iVar3);
              if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              Vec_IntPush(p_00,pVVar1->pArray[(ulong)uVar6 + uVar12 + 1]);
              uVar12 = uVar12 + 1;
            }
            for (; (uint)uVar12 < 4; uVar12 = (ulong)((uint)uVar12 + 1)) {
              Vec_IntPush(p_00,0);
            }
            puVar13 = Gia_ManConvertAigToTruth(p,pRoot,p_00,p_01,p_02);
            for (iVar4 = 0; iVar5 = p_00->nSize, iVar4 < iVar5; iVar4 = iVar4 + 1) {
              iVar5 = Vec_IntEntry(p_00,iVar4);
              pGVar11 = Gia_ManObj(p,iVar5);
              if (pGVar11 == (Gia_Obj_t *)0x0) {
                iVar5 = p_00->nSize;
                break;
              }
              uVar6 = 0;
              if (pGVar11->Value != 0xffffffff) {
                uVar6 = pGVar11->Value;
              }
              Vec_IntWriteEntry(p_00,iVar4,uVar6);
            }
            uVar12 = (ulong)(uint)(1 << ((char)iVar5 - 5U & 0x1f));
            uVar14 = uVar12;
            if (iVar5 < 6) {
              uVar12 = 1;
              uVar14 = uVar12;
            }
            do {
              if ((int)uVar12 < 1) {
                pRoot->Value = 0;
                goto LAB_00638d95;
              }
              lVar2 = uVar12 - 1;
              uVar12 = uVar12 - 1;
            } while (puVar13[lVar2] == 0);
            do {
              if ((int)uVar14 < 1) {
                pRoot->Value = 1;
                goto LAB_00638d95;
              }
              lVar2 = uVar14 - 1;
              uVar14 = uVar14 - 1;
            } while (puVar13[lVar2] == 0xffffffff);
            uVar6 = Dar_LibEvalBuild(p_04,p_00,(uint)(ushort)*puVar13,fKeepLevel,p_03);
            pRoot->Value = uVar6;
            pGVar11 = Gia_ObjFromLit(p_04,uVar6);
            uVar6 = Abc_LitNotCond(uVar6,(uint)((ulong)*(undefined8 *)pRoot >> 0x3f) ^
                                         (uint)pGVar11 & 1 ^
                                         (uint)((ulong)*(undefined8 *)
                                                        ((ulong)pGVar11 & 0xfffffffffffffffe) >>
                                               0x3f));
            pRoot->Value = uVar6;
          }
        }
        else {
          iVar4 = Abc_LitNotCond(pRoot[-uVar12].Value,uVar6 >> 0x1d & 1);
          iVar5 = Abc_Lit2Var(iVar4);
          if (p_04->nObjs <= iVar5) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          iVar5 = Abc_Lit2Var(iVar4);
          pGVar11 = Gia_ManObj(p_04,iVar5);
          if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && (int)*(uint *)pGVar11 < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar11 = Gia_ManAppendObj(p_04);
          *(ulong *)pGVar11 = *(ulong *)pGVar11 | 0x80000000;
          iVar5 = Gia_ObjId(p_04,pGVar11);
          iVar7 = Abc_Lit2Var(iVar4);
          *(ulong *)pGVar11 =
               *(ulong *)pGVar11 & 0xffffffffe0000000 | (ulong)(iVar5 - iVar7 & 0x1fffffff);
          iVar4 = Abc_LitIsCompl(iVar4);
          uVar12 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar12 & 0xffffffffdfffffff | (ulong)(uint)(iVar4 << 0x1d);
          *(ulong *)pGVar11 =
               uVar12 & 0xe0000000dfffffff | (ulong)(uint)(iVar4 << 0x1d) |
               (ulong)(p_04->vCos->nSize & 0x1fffffff) << 0x20;
          pVVar1 = p_04->vCos;
          iVar4 = Gia_ObjId(p_04,pGVar11);
          Vec_IntPush(pVVar1,iVar4);
          if (p_04->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_04,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),
                             pGVar11);
          }
          iVar4 = Gia_ObjId(p_04,pGVar11);
          pRoot->Value = iVar4 * 2;
        }
      }
LAB_00638d95:
      iVar3 = iVar3 + 1;
    }
    Gia_ManHashStop(p_04);
    iVar3 = Gia_ManHasDangling(p_04);
    if (iVar3 != 0) {
      p_05 = Gia_ManCleanup(p_04);
      if (fVerbose != 0) {
        uVar6 = Gia_ManAndNum(p_05);
        uVar8 = Gia_ManAndNum(p_04);
        if (uVar6 != uVar8) {
          printf("Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n",(ulong)uVar8,
                 (ulong)uVar6);
        }
      }
      Gia_ManStop(p_04);
      p_04 = p_05;
    }
    Gia_ManSetRegNum(p_04,p->nRegs);
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    Vec_IntFree(p_03);
    if (fVerbose != 0) {
      iVar3 = 0x7a8ff5;
      printf("Total gain in AIG nodes = %d.  ",(ulong)(uint)(p->nObjs - p_04->nObjs));
      Abc_Print(iVar3,"%s =","Total runtime");
      aVar15 = Abc_Clock();
      Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar15 - aVar9) / 1000000.0);
    }
  }
  else {
    puts("Resynthesis is not performed when nodes have more than 4 inputs.");
    p_04 = (Gia_Man_t *)0x0;
  }
  return p_04;
}

Assistant:

Gia_Man_t * Gia_ManMapShrink4( Gia_Man_t * p, int fKeepLevel, int fVerbose )
{
    Vec_Int_t * vLeaves, * vTruth, * vVisited, * vLeavesBest;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFanin;
    unsigned * pTruth;
    int i, k, iFan;
    abctime clk = Abc_Clock();
//    int ClassCounts[222] = {0};
    int * pLutClass, Counter = 0;
    assert( Gia_ManHasMapping(p) );
    if ( Gia_ManLutSizeMax( p ) > 4 )
    {
        printf( "Resynthesis is not performed when nodes have more than 4 inputs.\n" );
        return NULL;
    }
    pLutClass   = ABC_CALLOC( int, Gia_ManObjNum(p) );
    vLeaves     = Vec_IntAlloc( 0 );
    vTruth      = Vec_IntAlloc( (1<<16) );
    vVisited    = Vec_IntAlloc( 0 );
    vLeavesBest = Vec_IntAlloc( 4 );
    // prepare the library
    Dar_LibPrepare( 5 ); 
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pNew, Gia_ObjFromLit(pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            Counter++;
            // collect leaves of this gate
            Vec_IntClear( vLeaves );
            Gia_LutForEachFanin( p, i, iFan, k )
                Vec_IntPush( vLeaves, iFan );
            for ( ; k < 4; k++ )
                Vec_IntPush( vLeaves, 0 );
            //.compute the truth table 
            pTruth = Gia_ManConvertAigToTruth( p, pObj, vLeaves, vTruth, vVisited );
            // change from node IDs to their literals
            Gia_ManForEachObjVec( vLeaves, p, pFanin, k )
            {
//                assert( Gia_ObjValue(pFanin) != ~0 ); 
                Vec_IntWriteEntry( vLeaves, k, Gia_ObjValue(pFanin) != ~0 ? Gia_ObjValue(pFanin) : 0 );
            }
            // derive new structre
            if ( Gia_ManTruthIsConst0(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 0;
            else if ( Gia_ManTruthIsConst1(pTruth, Vec_IntSize(vLeaves)) )
                pObj->Value = 1;
            else
            {
                pObj->Value = Dar_LibEvalBuild( pNew, vLeaves, 0xffff & *pTruth, fKeepLevel, vLeavesBest );
                pObj->Value = Abc_LitNotCond( pObj->Value, Gia_ObjPhaseRealLit(pNew, pObj->Value) ^ pObj->fPhase );
            }
        }
    }
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( fVerbose && Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManMapShrink4() node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFree( vLeavesBest );
    if ( fVerbose )
    {
        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    ABC_FREE( pLutClass );
    return pNew;
}